

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Connection::fill_fd_set(Connection *this,fd_set *rdfds,fd_set *wrfds)

{
  if (this->data_c_f_ == 0) {
    rdfds->fds_bits[this->client_socket_ / 0x40] =
         rdfds->fds_bits[this->client_socket_ / 0x40] | 1L << ((byte)this->client_socket_ & 0x3f);
  }
  if (this->data_f_c_ == 0) {
    rdfds->fds_bits[this->forwarding_socket_ / 0x40] =
         rdfds->fds_bits[this->forwarding_socket_ / 0x40] |
         1L << ((byte)this->forwarding_socket_ & 0x3f);
  }
  if (0 < this->data_c_f_) {
    wrfds->fds_bits[this->forwarding_socket_ / 0x40] =
         wrfds->fds_bits[this->forwarding_socket_ / 0x40] |
         1L << ((byte)this->forwarding_socket_ & 0x3f);
  }
  if (0 < this->data_f_c_) {
    wrfds->fds_bits[this->client_socket_ / 0x40] =
         wrfds->fds_bits[this->client_socket_ / 0x40] | 1L << ((byte)this->client_socket_ & 0x3f);
  }
  return;
}

Assistant:

void Connection::fill_fd_set(fd_set &rdfds, fd_set &wrfds) {
    if (data_c_f_ == 0) {
        FD_SET(client_socket_, &rdfds);
    }
    if (data_f_c_ == 0) {
        FD_SET(forwarding_socket_, &rdfds);
    }
    if (data_c_f_ > 0) {
        FD_SET(forwarding_socket_, &wrfds);
    }
    if (data_f_c_ > 0) {
        FD_SET(client_socket_, &wrfds);
    }
}